

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O1

Bool Line_Up(black_PWorker worker,Long x1,Long y1,Long x2,Long y2,Long miny,Long maxy)

{
  FT_Long FVar1;
  PLong plVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long c_;
  int iVar10;
  bool bVar11;
  
  c_ = y2 - y1;
  if (y1 <= maxy && (miny <= y2 && (c_ != 0 && y1 <= y2))) {
    lVar7 = x2 - x1;
    if (miny - y1 == 0 || miny < y1) {
      iVar10 = (int)(y1 >> ((byte)worker->precision_bits & 0x3f));
      uVar3 = (uint)y1 & worker->precision - 1U;
    }
    else {
      FVar1 = FT_MulDiv(lVar7,miny - y1,c_);
      x1 = x1 + FVar1;
      iVar10 = (int)(miny >> ((byte)worker->precision_bits & 0x3f));
      uVar3 = 0;
    }
    bVar11 = true;
    if (y2 <= maxy) {
      bVar11 = (worker->precision - 1U & (uint)y2) == 0;
      maxy = y2;
    }
    iVar4 = (int)(maxy >> ((byte)worker->precision_bits & 0x3f));
    if ((int)uVar3 < 1) {
      if (worker->joint != '\0') {
        worker->top = worker->top + -1;
        worker->joint = '\0';
      }
    }
    else {
      if (iVar10 == iVar4) {
        return '\0';
      }
      FVar1 = FT_MulDiv(lVar7,(long)worker->precision - (long)(int)uVar3,c_);
      x1 = x1 + FVar1;
      iVar10 = iVar10 + 1;
    }
    worker->joint = bVar11;
    if (worker->fresh != '\0') {
      worker->cProfile->start = (long)iVar10;
      worker->fresh = '\0';
    }
    iVar4 = iVar4 - iVar10;
    if (worker->maxBuff <= worker->top + (long)iVar4 + 1) {
      worker->error = 0x62;
      return '\x01';
    }
    if (lVar7 < 1) {
      FVar1 = FT_MulDiv_No_Round((long)worker->precision,-lVar7,c_);
      FVar1 = -FVar1;
      lVar7 = (long)worker->precision * -lVar7;
      lVar5 = -1;
    }
    else {
      FVar1 = FT_MulDiv_No_Round((long)worker->precision,lVar7,c_);
      lVar7 = worker->precision * lVar7;
      lVar5 = 1;
    }
    plVar2 = worker->top;
    if (-1 < iVar4) {
      lVar6 = -c_;
      iVar4 = iVar4 + 2;
      do {
        *plVar2 = x1;
        lVar6 = lVar6 + lVar7 % c_;
        lVar8 = lVar5;
        lVar9 = c_;
        if (lVar6 < 0) {
          lVar8 = 0;
          lVar9 = 0;
        }
        lVar6 = lVar6 - lVar9;
        plVar2 = plVar2 + 1;
        x1 = x1 + FVar1 + lVar8;
        iVar4 = iVar4 + -1;
      } while (1 < iVar4);
    }
    worker->top = plVar2;
  }
  return '\0';
}

Assistant:

static Bool
  Line_Up( RAS_ARGS Long  x1,
                    Long  y1,
                    Long  x2,
                    Long  y2,
                    Long  miny,
                    Long  maxy )
  {
    Long   Dx, Dy;
    Int    e1, e2, f1, f2, size;     /* XXX: is `Short' sufficient? */
    Long   Ix, Rx, Ax;

    PLong  top;


    Dx = x2 - x1;
    Dy = y2 - y1;

    if ( Dy <= 0 || y2 < miny || y1 > maxy )
      return SUCCESS;

    if ( y1 < miny )
    {
      /* Take care: miny-y1 can be a very large value; we use     */
      /*            a slow MulDiv function to avoid clipping bugs */
      x1 += SMulDiv( Dx, miny - y1, Dy );
      e1  = (Int)TRUNC( miny );
      f1  = 0;
    }
    else
    {
      e1 = (Int)TRUNC( y1 );
      f1 = (Int)FRAC( y1 );
    }

    if ( y2 > maxy )
    {
      /* x2 += FMulDiv( Dx, maxy - y2, Dy );  UNNECESSARY */
      e2  = (Int)TRUNC( maxy );
      f2  = 0;
    }
    else
    {
      e2 = (Int)TRUNC( y2 );
      f2 = (Int)FRAC( y2 );
    }

    if ( f1 > 0 )
    {
      if ( e1 == e2 )
        return SUCCESS;
      else
      {
        x1 += SMulDiv( Dx, ras.precision - f1, Dy );
        e1 += 1;
      }
    }
    else
      if ( ras.joint )
      {
        ras.top--;
        ras.joint = FALSE;
      }

    ras.joint = (char)( f2 == 0 );

    if ( ras.fresh )
    {
      ras.cProfile->start = e1;
      ras.fresh           = FALSE;
    }

    size = e2 - e1 + 1;
    if ( ras.top + size >= ras.maxBuff )
    {
      ras.error = FT_THROW( Raster_Overflow );
      return FAILURE;
    }

    if ( Dx > 0 )
    {
      Ix = SMulDiv_No_Round( ras.precision, Dx, Dy );
      Rx = ( ras.precision * Dx ) % Dy;
      Dx = 1;
    }
    else
    {
      Ix = -SMulDiv_No_Round( ras.precision, -Dx, Dy );
      Rx = ( ras.precision * -Dx ) % Dy;
      Dx = -1;
    }

    Ax  = -Dy;
    top = ras.top;

    while ( size > 0 )
    {
      *top++ = x1;

      x1 += Ix;
      Ax += Rx;
      if ( Ax >= 0 )
      {
        Ax -= Dy;
        x1 += Dx;
      }
      size--;
    }

    ras.top = top;
    return SUCCESS;
  }